

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::ChangeOwnershipInfo,duckdb::CatalogType_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,duckdb::OnEntryNotFound_const&>
          (duckdb *this,CatalogType *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
          OnEntryNotFound *args_6)

{
  CatalogType entry_catalog_type;
  string owner_name_p;
  ChangeOwnershipInfo *this_00;
  _Alloc_hider in_stack_ffffffffffffff30;
  OnEntryNotFound in_stack_ffffffffffffff38;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  this_00 = (ChangeOwnershipInfo *)operator_new(0xb8);
  entry_catalog_type = *args;
  ::std::__cxx11::string::string((string *)&local_70,(string *)args_1);
  ::std::__cxx11::string::string((string *)&local_90,(string *)args_2);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)args_3);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff30,(string *)args_4);
  ::std::__cxx11::string::string(local_50,(string *)args_5);
  owner_name_p._M_string_length._0_1_ = *args_6;
  owner_name_p._M_dataplus._M_p = (pointer)local_50;
  owner_name_p._M_string_length._1_7_ = 0;
  owner_name_p.field_2._M_allocated_capacity = (size_type)this_00;
  owner_name_p.field_2._8_8_ = in_stack_ffffffffffffff30._M_p;
  ChangeOwnershipInfo::ChangeOwnershipInfo
            (this_00,entry_catalog_type,&local_70,&local_90,&local_b0,
             (string *)&stack0xffffffffffffff30,owner_name_p,in_stack_ffffffffffffff38);
  *(ChangeOwnershipInfo **)this = this_00;
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}